

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileFormat.h
# Opt level: O1

FileFormat InferFileFormat(string *filepath,FileFormat defaultFormat)

{
  _Rb_tree_color _Var1;
  _Base_ptr p_Var2;
  _Rb_tree_color _Var3;
  int iVar4;
  long lVar5;
  _Base_ptr p_Var6;
  _Rb_tree_color _Var7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ending;
  _Base_ptr p_Var8;
  bool bVar9;
  bool bVar10;
  undefined1 *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ext;
  
  lVar5 = std::__cxx11::string::find_last_of((char *)filepath,0x1840b6,0xffffffffffffffff);
  if (lVar5 != -1) {
    std::__cxx11::string::substr((ulong)&local_70,(ulong)filepath);
    _Var3 = defaultFormat;
    if ((_Rb_tree_header *)
        FileFormatEndings_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
        &FileFormatEndings_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
      ext.field_2._8_8_ = local_70;
      p_Var6 = FileFormatEndings_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      _Var7 = defaultFormat;
      do {
        p_Var8 = p_Var6[1]._M_parent;
        p_Var2 = p_Var6[1]._M_left;
        bVar9 = p_Var8 == p_Var2;
        _Var3 = _Var7;
        if (!bVar9) {
          _Var1 = p_Var6[1]._M_color;
          do {
            bVar10 = (_Base_ptr)ext._M_dataplus._M_p == p_Var8->_M_parent;
            if (bVar10 && ext._M_dataplus._M_p != (pointer)0x0) {
              iVar4 = bcmp((void *)ext.field_2._8_8_,*(void **)p_Var8,(size_t)ext._M_dataplus._M_p);
              bVar10 = iVar4 == 0;
            }
            _Var3 = _Var1;
            if (bVar10) break;
            p_Var8 = p_Var8 + 1;
            bVar9 = p_Var8 == p_Var2;
            _Var3 = _Var7;
          } while (!bVar9);
        }
        _Var7 = _Var3;
        _Var3 = _Var7;
      } while ((bVar9) &&
              (p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6), _Var3 = defaultFormat,
              (_Rb_tree_header *)p_Var6 !=
              &FileFormatEndings_abi_cxx11_._M_t._M_impl.super__Rb_tree_header));
    }
    defaultFormat = _Var3;
    if ((size_type *)local_70 != &ext._M_string_length) {
      operator_delete(local_70);
    }
  }
  return defaultFormat;
}

Assistant:

static FileFormat InferFileFormat( const std::string& filepath, const FileFormat defaultFormat ) {
  auto pos = filepath.find_last_of( "." );
  if( pos == std::string::npos )
    return defaultFormat;

  auto ext = filepath.substr( pos + 1 );
  for( auto &ff : FileFormatEndings ) {
    for( auto &ending : ff.second ) {
      if( ext == ending )
        return ff.first;
    }
  }
  return defaultFormat;
}